

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_4161a3::Db::parseEncoding(Db *this)

{
  char cVar1;
  bool bVar2;
  NodeArray local_b0;
  Node *local_a0;
  Node *Ty;
  size_t ParamsBegin;
  Node *local_80;
  Node *ReturnType;
  Node *local_68;
  Node *Arg;
  size_t BeforeArgs;
  EnableIfAttr *local_48;
  Node *Attrs;
  Node *Name;
  NameState NameInfo;
  anon_class_8_1_8991fb9c IsEndOfEncoding;
  Db *this_local;
  
  cVar1 = look(this,0);
  if ((cVar1 == 'G') || (cVar1 = look(this,0), cVar1 == 'T')) {
    this_local = (Db *)parseSpecialName(this);
  }
  else {
    NameInfo.ForwardTemplateRefsBegin = (size_t)this;
    NameState::NameState((NameState *)&Name,this);
    Attrs = parseName(this,(NameState *)&Name);
    if (Attrs == (Node *)0x0) {
      this_local = (Db *)0x0;
    }
    else {
      bVar2 = resolveForwardTemplateRefs(this,(NameState *)&Name);
      if (bVar2) {
        this_local = (Db *)0x0;
      }
      else {
        bVar2 = parseEncoding::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)&NameInfo.ForwardTemplateRefsBegin);
        if (bVar2) {
          this_local = (Db *)Attrs;
        }
        else {
          local_48 = (EnableIfAttr *)0x0;
          StringView::StringView((StringView *)&BeforeArgs,"Ua9enable_ifI");
          bVar2 = consumeIf(this,_BeforeArgs);
          if (bVar2) {
            Arg = (Node *)PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::size(&this->Names);
            while (bVar2 = consumeIf(this,'E'), ((bVar2 ^ 0xffU) & 1) != 0) {
              local_68 = parseTemplateArg(this);
              if (local_68 == (Node *)0x0) {
                return (Node *)0x0;
              }
              PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_68)
              ;
            }
            _ReturnType = popTrailingNodeArray(this,(size_t)Arg);
            local_48 = (anonymous_namespace)::Db::
                       make<(anonymous_namespace)::EnableIfAttr,(anonymous_namespace)::NodeArray>
                                 ((Db *)this,(NodeArray *)&ReturnType);
          }
          local_80 = (Node *)0x0;
          if (((((byte)Name & 1) == 0) && ((Name._1_1_ & 1) != 0)) &&
             (local_80 = parseType(this), local_80 == (Node *)0x0)) {
            this_local = (Db *)0x0;
          }
          else {
            bVar2 = consumeIf(this,'v');
            if (bVar2) {
              NodeArray::NodeArray((NodeArray *)&ParamsBegin);
              this_local = (Db *)(anonymous_namespace)::Db::
                                 make<(anonymous_namespace)::FunctionEncoding,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&,(anonymous_namespace)::NodeArray,(anonymous_namespace)::Node*&,(anonymous_namespace)::Qualifiers&,(anonymous_namespace)::FunctionRefQual&>
                                           ((Db *)this,&local_80,&Attrs,(NodeArray *)&ParamsBegin,
                                            (Node **)&local_48,(Qualifiers *)((long)&Name + 4),
                                            &NameInfo.CtorDtorConversion);
            }
            else {
              Ty = (Node *)PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::size(&this->Names);
              do {
                local_a0 = parseType(this);
                if (local_a0 == (Node *)0x0) {
                  return (Node *)0x0;
                }
                PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                          (&this->Names,&local_a0);
                bVar2 = parseEncoding::anon_class_8_1_8991fb9c::operator()
                                  ((anon_class_8_1_8991fb9c *)&NameInfo.ForwardTemplateRefsBegin);
              } while (((bVar2 ^ 0xffU) & 1) != 0);
              local_b0 = popTrailingNodeArray(this,(size_t)Ty);
              this_local = (Db *)(anonymous_namespace)::Db::
                                 make<(anonymous_namespace)::FunctionEncoding,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&,(anonymous_namespace)::NodeArray,(anonymous_namespace)::Node*&,(anonymous_namespace)::Qualifiers&,(anonymous_namespace)::FunctionRefQual&>
                                           ((Db *)this,&local_80,&Attrs,&local_b0,(Node **)&local_48
                                            ,(Qualifiers *)((long)&Name + 4),
                                            &NameInfo.CtorDtorConversion);
            }
          }
        }
      }
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseEncoding() {
  if (look() == 'G' || look() == 'T')
    return parseSpecialName();

  auto IsEndOfEncoding = [&] {
    // The set of chars that can potentially follow an <encoding> (none of which
    // can start a <type>). Enumerating these allows us to avoid speculative
    // parsing.
    return numLeft() == 0 || look() == 'E' || look() == '.' || look() == '_';
  };

  NameState NameInfo(this);
  Node *Name = parseName(&NameInfo);
  if (Name == nullptr)
    return nullptr;

  if (resolveForwardTemplateRefs(NameInfo))
    return nullptr;

  if (IsEndOfEncoding())
    return Name;

  Node *Attrs = nullptr;
  if (consumeIf("Ua9enable_ifI")) {
    size_t BeforeArgs = Names.size();
    while (!consumeIf('E')) {
      Node *Arg = parseTemplateArg();
      if (Arg == nullptr)
        return nullptr;
      Names.push_back(Arg);
    }
    Attrs = make<EnableIfAttr>(popTrailingNodeArray(BeforeArgs));
  }

  Node *ReturnType = nullptr;
  if (!NameInfo.CtorDtorConversion && NameInfo.EndsWithTemplateArgs) {
    ReturnType = parseType();
    if (ReturnType == nullptr)
      return nullptr;
  }

  if (consumeIf('v'))
    return make<FunctionEncoding>(ReturnType, Name, NodeArray(),
                                  Attrs, NameInfo.CVQualifiers,
                                  NameInfo.ReferenceQualifier);

  size_t ParamsBegin = Names.size();
  do {
    Node *Ty = parseType();
    if (Ty == nullptr)
      return nullptr;
    Names.push_back(Ty);
  } while (!IsEndOfEncoding());

  return make<FunctionEncoding>(ReturnType, Name,
                                popTrailingNodeArray(ParamsBegin),
                                Attrs, NameInfo.CVQualifiers,
                                NameInfo.ReferenceQualifier);
}